

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

NetworkUpdateParameters *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::NetworkUpdateParameters>
          (Arena *arena)

{
  NetworkUpdateParameters *pNVar1;
  
  if (arena != (Arena *)0x0) {
    pNVar1 = DoCreateMessage<CoreML::Specification::NetworkUpdateParameters>(arena);
    return pNVar1;
  }
  pNVar1 = (NetworkUpdateParameters *)operator_new(0x50);
  CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(pNVar1,(Arena *)0x0,false)
  ;
  return pNVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }